

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall QTableModel::clearContents(QTableModel *this)

{
  QList<QTableWidgetItem_*> *this_00;
  qsizetype qVar1;
  const_reference ppQVar2;
  reference ppQVar3;
  long in_RDI;
  int i;
  QTableWidgetItem *in_stack_ffffffffffffffd8;
  int local_c;
  
  QAbstractItemModel::beginResetModel();
  local_c = 0;
  while( true ) {
    this_00 = (QList<QTableWidgetItem_*> *)(long)local_c;
    qVar1 = QList<QTableWidgetItem_*>::size((QList<QTableWidgetItem_*> *)(in_RDI + 0x18));
    if (qVar1 <= (long)this_00) break;
    ppQVar2 = QList<QTableWidgetItem_*>::at(this_00,(qsizetype)in_stack_ffffffffffffffd8);
    if (*ppQVar2 != (QTableWidgetItem *)0x0) {
      ppQVar2 = QList<QTableWidgetItem_*>::at(this_00,(qsizetype)in_stack_ffffffffffffffd8);
      (*ppQVar2)->view = (QTableWidget *)0x0;
      ppQVar2 = QList<QTableWidgetItem_*>::at(this_00,(qsizetype)in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffd8 = *ppQVar2;
      if (in_stack_ffffffffffffffd8 != (QTableWidgetItem *)0x0) {
        (*in_stack_ffffffffffffffd8->_vptr_QTableWidgetItem[1])();
      }
      ppQVar3 = QList<QTableWidgetItem_*>::operator[](this_00,(qsizetype)in_stack_ffffffffffffffd8);
      *ppQVar3 = (QTableWidgetItem *)0x0;
    }
    local_c = local_c + 1;
  }
  QAbstractItemModel::endResetModel();
  return;
}

Assistant:

void QTableModel::clearContents()
{
    beginResetModel();
    for (int i = 0; i < tableItems.size(); ++i) {
        if (tableItems.at(i)) {
            tableItems.at(i)->view = nullptr;
            delete tableItems.at(i);
            tableItems[i] = 0;
        }
    }
    endResetModel();
}